

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

btBroadphaseProxy * __thiscall
btAxisSweep3Internal<unsigned_short>::createProxy
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          int shapeType,void *userPtr,short collisionFilterGroup,short collisionFilterMask,
          btDispatcher *dispatcher,void *multiSapProxy)

{
  btDbvtBroadphase *pbVar1;
  unsigned_short uVar2;
  int iVar3;
  undefined4 extraout_var;
  btBroadphaseProxy *pbVar4;
  
  uVar2 = addHandle(this,aabbMin,aabbMax,userPtr,collisionFilterGroup,collisionFilterMask,dispatcher
                    ,multiSapProxy);
  pbVar4 = (btBroadphaseProxy *)
           ((long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
           ((ulong)((uint)uVar2 * 0x50) - 0x1c));
  pbVar1 = this->m_raycastAccelerator;
  if (pbVar1 != (btDbvtBroadphase *)0x0) {
    iVar3 = (*(pbVar1->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[2])
                      (pbVar1,aabbMin,aabbMax,(ulong)(uint)shapeType,userPtr,
                       (ulong)(uint)(int)collisionFilterGroup,(ulong)(uint)(int)collisionFilterMask,
                       dispatcher,0);
    pbVar4[1].m_collisionFilterGroup = (short)iVar3;
    pbVar4[1].m_collisionFilterMask = (short)((uint)iVar3 >> 0x10);
    *(undefined4 *)&pbVar4[1].field_0xc = extraout_var;
  }
  return pbVar4;
}

Assistant:

btBroadphaseProxy*	btAxisSweep3Internal<BP_FP_INT_TYPE>::createProxy(  const btVector3& aabbMin,  const btVector3& aabbMax,int shapeType,void* userPtr,short int collisionFilterGroup,short int collisionFilterMask,btDispatcher* dispatcher,void* multiSapProxy)
{
		(void)shapeType;
		BP_FP_INT_TYPE handleId = addHandle(aabbMin,aabbMax, userPtr,collisionFilterGroup,collisionFilterMask,dispatcher,multiSapProxy);
		
		Handle* handle = getHandle(handleId);
		
		if (m_raycastAccelerator)
		{
			btBroadphaseProxy* rayProxy = m_raycastAccelerator->createProxy(aabbMin,aabbMax,shapeType,userPtr,collisionFilterGroup,collisionFilterMask,dispatcher,0);
			handle->m_dbvtProxy = rayProxy;
		}
		return handle;
}